

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yyDo(GREG *G,yyaction action,int begin,int end,char *name)

{
  int iVar1;
  int iVar2;
  yythunk *pyVar3;
  
  while( true ) {
    iVar1 = G->thunkpos;
    iVar2 = G->thunkslen;
    if (iVar1 < iVar2) break;
    G->thunkslen = iVar2 * 2;
    pyVar3 = (yythunk *)realloc(G->thunks,(long)iVar2 << 6);
    G->thunks = pyVar3;
  }
  pyVar3 = G->thunks;
  pyVar3[iVar1].begin = begin;
  pyVar3[iVar1].end = end;
  pyVar3[iVar1].action = action;
  pyVar3[iVar1].name = name;
  G->thunkpos = iVar1 + 1;
  return;
}

Assistant:

YY_LOCAL(void) yyDo(GREG *G, yyaction action, int begin, int end, const char *name)
{
  while (G->thunkpos >= G->thunkslen)
    {
      G->thunkslen *= 2;
      G->thunks= (yythunk*)YY_REALLOC(G->thunks, sizeof(yythunk) * G->thunkslen, G->data);
    }
  G->thunks[G->thunkpos].begin=  begin;
  G->thunks[G->thunkpos].end=    end;
  G->thunks[G->thunkpos].action= action;
  G->thunks[G->thunkpos].name= name;
  ++G->thunkpos;
}